

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void __thiscall
spatial_region::f_init_cos
          (spatial_region *this,double a0y,double a0z,double xsigma,double ysigma,double zsigma,
          double x0,int sscos,bool b_sign,double x1,double phase,double y0,double z0,bool append,
          double phi,double xtarget,double ytarget,double ztarget)

{
  double dVar1;
  celle ***pppcVar2;
  cellb ***pppcVar3;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  int *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double in_XMM1_Qa;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [64];
  double in_XMM2_Qa;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  double in_XMM3_Qa;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  double in_XMM4_Qa;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  ulong in_XMM5_Qa;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  double r_1;
  double r;
  int k;
  int j;
  int i;
  double bz;
  double by;
  double bx;
  double ez;
  double ey;
  double ex;
  double zz;
  double zy;
  double zx;
  double yz;
  double yy;
  double yx;
  double s;
  double c;
  double z0z;
  double z0y;
  double z0x;
  double y0z;
  double y0y;
  double y0x;
  double r0z;
  double r0y;
  double r0x;
  double z12;
  double y12;
  double tr_envelope;
  double sinz;
  double siny;
  double sinx;
  double cosz;
  double cosy;
  double cosx;
  double zs;
  double ys;
  double xs;
  double xi;
  double z;
  double y;
  double x;
  int in_stack_fffffffffffffc3c;
  field3d<cellb> *in_stack_fffffffffffffc40;
  int local_19c;
  int local_198;
  int local_194;
  double local_190;
  double local_188;
  ulong local_180;
  double local_178;
  double local_170;
  ulong local_168;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_b8;
  double local_a0;
  double local_90;
  double local_88;
  double local_80;
  
  local_80 = 0.0;
  local_88 = 0.0;
  local_90 = 0.0;
  if (in_ESI == 0) {
    dVar4 = sqrt(6.283185307179586);
    local_80 = (in_XMM2_Qa * 2.0 * dVar4) / 3.0;
    dVar4 = sqrt(6.283185307179586);
    local_88 = (in_XMM3_Qa * 2.0 * dVar4) / 3.0;
    dVar4 = sqrt(6.283185307179586);
    local_90 = (in_XMM4_Qa * 2.0 * dVar4) / 3.0;
  }
  else if (in_ESI == 1) {
    local_80 = in_XMM2_Qa * 0.822;
    local_88 = in_XMM3_Qa * 0.822;
    local_90 = in_XMM4_Qa * 0.822;
  }
  else if (in_ESI == 2) {
    dVar4 = sqrt(6.283185307179586);
    local_80 = (in_XMM2_Qa * 2.0 * dVar4) / 3.0;
    local_88 = in_XMM3_Qa * 100.0;
    local_90 = in_XMM3_Qa * 100.0;
  }
  else if (in_ESI == 3) {
    dVar4 = sqrt(6.283185307179586);
    local_80 = (in_XMM2_Qa * 2.0 * dVar4) / 3.0;
    local_88 = in_XMM3_Qa * 0.822;
    local_90 = in_XMM4_Qa * 0.822;
  }
  dVar4 = (double)in_RDI[1] * 0.5 * *(double *)(in_RDI + 6);
  dVar1 = (double)in_RDI[2] * 0.5 * *(double *)(in_RDI + 8);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = in_XMM6_Qa;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = in_XMM6_Qa;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = in_stack_00000008 * in_stack_00000008;
  auVar18 = vfmadd213sd_fma(auVar127,auVar18,auVar68);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = in_stack_00000010;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = in_stack_00000010;
  auVar18 = vfmadd213sd_fma(auVar19,auVar69,auVar18);
  dVar5 = sqrt(auVar18._0_8_);
  dVar6 = -in_stack_00000008 / dVar5;
  dVar7 = -in_stack_00000010 / dVar5;
  auVar20._0_8_ = -in_XMM6_Qa / dVar5;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = auVar20._0_8_;
  auVar20._8_8_ = 0;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = dVar6 * dVar6;
  auVar18 = vfmadd213sd_fma(auVar20,auVar70,auVar128);
  local_100 = sqrt(auVar18._0_8_);
  if ((local_100 != 0.0) || (NAN(local_100))) {
    local_f8 = -dVar6 / local_100;
    local_100 = auVar20._0_8_ / local_100;
  }
  else {
    local_f8 = 0.0;
    local_100 = 1.0;
  }
  local_108 = 0.0;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar6;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = -(dVar7 * local_100);
  auVar18 = vfmadd213sd_fma(ZEXT816(0),auVar71,auVar129);
  local_110 = auVar18._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar7;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_f8;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = -(auVar20._0_8_ * 0.0);
  auVar18 = vfmadd213sd_fma(auVar21,auVar72,auVar130);
  local_118 = auVar18._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = auVar20._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_100;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = -(dVar6 * local_f8);
  auVar18 = vfmadd213sd_fma(auVar22,auVar73,auVar131);
  local_120 = auVar18._0_8_;
  auVar78 = ZEXT816(0);
  if ((in_stack_00000018 != 0.0) || (NAN(in_stack_00000018))) {
    auVar23._0_8_ = cos(in_stack_00000018);
    dVar5 = sin(in_stack_00000018);
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_f8;
    auVar23._8_8_ = 0;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = local_110 * dVar5;
    auVar18 = vfmadd213sd_fma(auVar23,auVar74,auVar132);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_100;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auVar23._0_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = local_118 * dVar5;
    auVar19 = vfmadd213sd_fma(auVar24,auVar75,auVar133);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = auVar23._0_8_;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = local_120 * dVar5;
    auVar68 = vfmadd213sd_fma(auVar25,ZEXT816(0),auVar134);
    local_108 = auVar68._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_110;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auVar23._0_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = -(local_f8 * dVar5);
    auVar68 = vfmadd213sd_fma(auVar26,auVar76,auVar135);
    local_110 = auVar68._0_8_;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_118;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auVar23._0_8_;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = -(local_100 * dVar5);
    auVar68 = vfmadd213sd_fma(auVar27,auVar77,auVar136);
    local_118 = auVar68._0_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_120;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = auVar23._0_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = -(dVar5 * 0.0);
    auVar68 = vfmadd213sd_fma(auVar28,auVar78,auVar137);
    local_120 = auVar68._0_8_;
    local_100 = auVar19._0_8_;
    local_f8 = auVar18._0_8_;
  }
  auVar126 = ZEXT1664(auVar78);
  local_168 = 0;
  local_170 = 0.0;
  local_178 = 0.0;
  local_180 = 0;
  local_188 = 0.0;
  local_190 = 0.0;
  for (local_194 = 0; local_194 < *in_RDI; local_194 = local_194 + 1) {
    for (local_198 = 0; local_198 < in_RDI[1]; local_198 = local_198 + 1) {
      for (local_19c = 0; local_19c < in_RDI[2]; local_19c = local_19c + 1) {
        auVar29._8_8_ = 0;
        auVar29._0_8_ = auVar20._0_8_;
        auVar138._0_8_ = (double)local_194;
        auVar138._8_8_ = auVar126._8_8_;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *(ulong *)(in_RDI + 4);
        auVar170._8_8_ = 0;
        auVar170._0_8_ = in_XMM5_Qa ^ 0x8000000000000000;
        auVar18 = vfmadd213sd_fma(auVar79,auVar138,auVar170);
        auVar187._0_8_ = (double)local_198;
        auVar187._8_8_ = 0;
        auVar171._8_8_ = 0;
        auVar171._0_8_ = *(ulong *)(in_RDI + 6);
        auVar193._8_8_ = 0;
        auVar193._0_8_ = -dVar4;
        auVar19 = vfmadd213sd_fma(auVar171,auVar187,auVar193);
        auVar80._8_8_ = 0;
        auVar80._0_8_ = dVar6 * ((auVar19._0_8_ - in_stack_00000008) - in_stack_00000028);
        auVar139._8_8_ = 0;
        auVar139._0_8_ = auVar18._0_8_ - in_stack_00000020;
        auVar18 = vfmadd213sd_fma(auVar139,auVar29,auVar80);
        auVar81._8_8_ = 0;
        auVar81._0_8_ = dVar7;
        auVar172._0_8_ = (double)local_19c;
        auVar172._8_8_ = 0;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(in_RDI + 8);
        auVar188._8_8_ = 0;
        auVar188._0_8_ = -dVar1;
        auVar19 = vfmadd213sd_fma(auVar30,auVar172,auVar188);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = (auVar19._0_8_ - in_stack_00000010) - in_stack_00000030;
        auVar18 = vfmadd213sd_fma(auVar31,auVar81,auVar18);
        dVar15 = auVar18._0_8_;
        dVar5 = dVar15 + in_XMM7_Qa;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = local_f8;
        auVar140._0_8_ = (double)local_194;
        auVar140._8_8_ = 0;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = *(ulong *)(in_RDI + 4);
        auVar173._8_8_ = 0;
        auVar173._0_8_ = in_XMM5_Qa ^ 0x8000000000000000;
        auVar18 = vfmadd213sd_fma(auVar82,auVar140,auVar173);
        auVar189._0_8_ = (double)local_198;
        auVar189._8_8_ = 0;
        auVar174._8_8_ = 0;
        auVar174._0_8_ = *(ulong *)(in_RDI + 6);
        auVar194._8_8_ = 0;
        auVar194._0_8_ = -dVar4;
        auVar19 = vfmadd213sd_fma(auVar174,auVar189,auVar194);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = local_100 * ((auVar19._0_8_ - in_stack_00000008) - in_stack_00000028);
        auVar141._8_8_ = 0;
        auVar141._0_8_ = auVar18._0_8_ - in_stack_00000020;
        auVar18 = vfmadd213sd_fma(auVar141,auVar32,auVar83);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = local_108;
        auVar175._0_8_ = (double)local_19c;
        auVar175._8_8_ = 0;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(in_RDI + 8);
        auVar190._8_8_ = 0;
        auVar190._0_8_ = -dVar1;
        auVar19 = vfmadd213sd_fma(auVar33,auVar175,auVar190);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = (auVar19._0_8_ - in_stack_00000010) - in_stack_00000030;
        auVar18 = vfmadd213sd_fma(auVar34,auVar84,auVar18);
        auVar42._0_8_ = auVar18._0_8_;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = local_110;
        auVar142._0_8_ = (double)local_194;
        auVar142._8_8_ = 0;
        auVar85._8_8_ = 0;
        auVar85._0_8_ = *(ulong *)(in_RDI + 4);
        auVar176._8_8_ = 0;
        auVar176._0_8_ = in_XMM5_Qa ^ 0x8000000000000000;
        auVar18 = vfmadd213sd_fma(auVar85,auVar142,auVar176);
        auVar191._0_8_ = (double)local_198;
        auVar191._8_8_ = 0;
        auVar177._8_8_ = 0;
        auVar177._0_8_ = *(ulong *)(in_RDI + 6);
        auVar195._8_8_ = 0;
        auVar195._0_8_ = -dVar4;
        auVar19 = vfmadd213sd_fma(auVar177,auVar191,auVar195);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = local_118 * ((auVar19._0_8_ - in_stack_00000008) - in_stack_00000028);
        auVar143._8_8_ = 0;
        auVar143._0_8_ = auVar18._0_8_ - in_stack_00000020;
        auVar18 = vfmadd213sd_fma(auVar143,auVar35,auVar86);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = local_120;
        auVar178._0_8_ = (double)local_19c;
        auVar178._8_8_ = 0;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)(in_RDI + 8);
        auVar192._8_8_ = 0;
        auVar192._0_8_ = -dVar1;
        auVar19 = vfmadd213sd_fma(auVar36,auVar178,auVar192);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = (auVar19._0_8_ - in_stack_00000010) - in_stack_00000030;
        auVar18 = vfmadd213sd_fma(auVar37,auVar87,auVar18);
        dVar12 = auVar18._0_8_;
        auVar126 = ZEXT864((ulong)dVar15);
        if (((((local_80 <= dVar15) || (auVar126 = ZEXT864((ulong)-local_80), dVar15 <= -local_80))
             || (auVar126 = ZEXT864((ulong)auVar42._0_8_), local_88 <= auVar42._0_8_)) ||
            ((auVar126 = ZEXT864((ulong)-local_88), auVar42._0_8_ <= -local_88 ||
             (auVar126 = ZEXT864((ulong)dVar12), local_90 <= dVar12)))) ||
           (auVar126 = ZEXT864((ulong)-local_90), dVar12 <= -local_90)) {
          if ((in_CL & 1) == 0) {
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffc40,
                                  in_stack_fffffffffffffc3c);
            (*pppcVar2)[local_198][local_19c].ex = 0.0;
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffc40,
                                  in_stack_fffffffffffffc3c);
            (*pppcVar2)[local_198][local_19c].ey = 0.0;
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffc40,
                                  in_stack_fffffffffffffc3c);
            (*pppcVar2)[local_198][local_19c].ez = 0.0;
            pppcVar3 = field3d<cellb>::operator[]
                                 (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
            (*pppcVar3)[local_198][local_19c].bx = 0.0;
            pppcVar3 = field3d<cellb>::operator[]
                                 (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
            (*pppcVar3)[local_198][local_19c].by = 0.0;
            pppcVar3 = field3d<cellb>::operator[]
                                 (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
            (*pppcVar3)[local_198][local_19c].bz = 0.0;
          }
        }
        else {
          if (in_ESI == 0) {
            dVar8 = cos(((dVar15 * 3.141592653589793) / 2.0) / local_80);
            dVar9 = cos(((auVar42._0_8_ * 3.141592653589793) / 2.0) / local_88);
            dVar10 = cos(((dVar12 * 3.141592653589793) / 2.0) / local_90);
            dVar11 = sin(((dVar15 * 3.141592653589793) / 2.0) / local_80);
            auVar38._0_8_ = sin(((auVar42._0_8_ * 3.141592653589793) / 2.0) / local_88);
            dVar12 = sin(((dVar12 * 3.141592653589793) / 2.0) / local_90);
            dVar15 = dVar9 * dVar9 * dVar10 * dVar10;
            dVar13 = cos(dVar5);
            dVar14 = sin(dVar5);
            auVar88._8_8_ = 0;
            auVar88._0_8_ = dVar8;
            auVar144._8_8_ = 0;
            auVar144._0_8_ = dVar13 * dVar8;
            auVar179._8_8_ = 0;
            auVar179._0_8_ = -((3.141592653589793 / local_80) * dVar14 * dVar8 * dVar11);
            auVar18 = vfmadd213sd_fma(auVar88,auVar144,auVar179);
            local_190 = in_XMM0_Qa * dVar15 * auVar18._0_8_;
            dVar13 = sin(dVar5);
            dVar14 = cos(dVar5);
            auVar89._8_8_ = 0;
            auVar89._0_8_ = dVar8;
            auVar145._8_8_ = 0;
            auVar145._0_8_ = dVar13 * dVar8;
            auVar180._8_8_ = 0;
            auVar180._0_8_ = (3.141592653589793 / local_80) * dVar14 * dVar8 * dVar11;
            auVar18 = vfmadd213sd_fma(auVar89,auVar145,auVar180);
            local_178 = in_XMM1_Qa * dVar15 * auVar18._0_8_;
            local_188 = -local_178;
            dVar15 = sin(dVar5);
            dVar11 = cos(dVar5);
            auVar90._8_8_ = 0;
            auVar90._0_8_ =
                 ((in_XMM0_Qa * dVar15 * dVar8 * dVar8 * dVar10 * dVar10 * 3.141592653589793) /
                 local_88) * dVar9;
            auVar38._8_8_ = 0;
            auVar146._8_8_ = 0;
            auVar146._0_8_ =
                 -(((in_XMM1_Qa * dVar11 * dVar8 * dVar8 * dVar9 * dVar9 * 3.141592653589793) /
                   local_90) * dVar10 * dVar12);
            auVar18 = vfmadd213sd_fma(auVar38,auVar90,auVar146);
            local_168 = auVar18._0_8_;
            dVar15 = cos(dVar5);
            dVar5 = sin(dVar5);
            auVar91._8_8_ = 0;
            auVar91._0_8_ =
                 ((in_XMM1_Qa * dVar15 * dVar8 * dVar8 * 3.141592653589793) / local_88) * dVar10 *
                 dVar10 * dVar9;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = auVar38._0_8_;
            auVar147._8_8_ = 0;
            auVar147._0_8_ =
                 ((in_XMM0_Qa * dVar5 * dVar8 * dVar8 * dVar9 * dVar9 * 3.141592653589793) /
                 local_90) * dVar10 * dVar12;
            auVar18 = vfmadd213sd_fma(auVar39,auVar91,auVar147);
            local_180 = auVar18._0_8_;
            local_170 = local_190;
          }
          else if (in_ESI == 1) {
            dVar9 = cos(((dVar15 * 3.141592653589793 * dVar15 * dVar15 * dVar15) / 2.0) /
                        (local_80 * local_80 * local_80 * local_80));
            dVar10 = cos(((auVar42._0_8_ * 3.141592653589793 * auVar42._0_8_ * auVar42._0_8_ *
                          auVar42._0_8_) / 2.0) / (local_88 * local_88 * local_88 * local_88));
            dVar11 = cos(((dVar12 * 3.141592653589793 * dVar12 * dVar12 * dVar12) / 2.0) /
                         (local_90 * local_90 * local_90 * local_90));
            dVar13 = sin(((dVar15 * 3.141592653589793 * dVar15 * dVar15 * dVar15) / 2.0) /
                         (local_80 * local_80 * local_80 * local_80));
            auVar40._0_8_ =
                 sin(((auVar42._0_8_ * 3.141592653589793 * auVar42._0_8_ * auVar42._0_8_ *
                      auVar42._0_8_) / 2.0) / (local_88 * local_88 * local_88 * local_88));
            dVar14 = sin(((dVar12 * 3.141592653589793 * dVar12 * dVar12 * dVar12) / 2.0) /
                         (local_90 * local_90 * local_90 * local_90));
            dVar8 = dVar10 * dVar10 * dVar11 * dVar11;
            dVar16 = cos(dVar5);
            dVar17 = sin(dVar5);
            auVar92._8_8_ = 0;
            auVar92._0_8_ = dVar9;
            auVar148._8_8_ = 0;
            auVar148._0_8_ = dVar16 * dVar9;
            auVar181._8_8_ = 0;
            auVar181._0_8_ =
                 -(((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                   (local_80 * local_80 * local_80 * local_80)) * dVar17 * dVar9 * dVar13);
            auVar18 = vfmadd213sd_fma(auVar92,auVar148,auVar181);
            local_190 = in_XMM0_Qa * dVar8 * auVar18._0_8_;
            dVar16 = sin(dVar5);
            dVar17 = cos(dVar5);
            auVar93._8_8_ = 0;
            auVar93._0_8_ = dVar9;
            auVar149._8_8_ = 0;
            auVar149._0_8_ = dVar16 * dVar9;
            auVar182._8_8_ = 0;
            auVar182._0_8_ =
                 ((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                 (local_80 * local_80 * local_80 * local_80)) * dVar17 * dVar9 * dVar13;
            auVar18 = vfmadd213sd_fma(auVar93,auVar149,auVar182);
            local_178 = in_XMM1_Qa * dVar8 * auVar18._0_8_;
            local_188 = -local_178;
            dVar15 = sin(dVar5);
            dVar8 = cos(dVar5);
            auVar94._8_8_ = 0;
            auVar94._0_8_ =
                 ((in_XMM0_Qa * dVar15 * 4.0 * 3.141592653589793 * auVar42._0_8_ * auVar42._0_8_ *
                  auVar42._0_8_) / (local_88 * local_88 * local_88 * local_88)) * dVar9 * dVar9 *
                 dVar11 * dVar11 * dVar10;
            auVar40._8_8_ = 0;
            auVar150._8_8_ = 0;
            auVar150._0_8_ =
                 -(((in_XMM1_Qa * dVar8 * 4.0 * 3.141592653589793 * dVar12 * dVar12 * dVar12) /
                   (local_90 * local_90 * local_90 * local_90)) * dVar9 * dVar9 * dVar10 * dVar10 *
                   dVar11 * dVar14);
            auVar18 = vfmadd213sd_fma(auVar40,auVar94,auVar150);
            local_168 = auVar18._0_8_;
            dVar15 = cos(dVar5);
            dVar5 = sin(dVar5);
            auVar95._8_8_ = 0;
            auVar95._0_8_ =
                 ((in_XMM1_Qa * dVar15 * 4.0 * 3.141592653589793 * auVar42._0_8_ * auVar42._0_8_ *
                  auVar42._0_8_) / (local_88 * local_88 * local_88 * local_88)) * dVar9 * dVar9 *
                 dVar11 * dVar11 * dVar10;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = auVar40._0_8_;
            auVar151._8_8_ = 0;
            auVar151._0_8_ =
                 ((in_XMM0_Qa * dVar5 * 4.0 * 3.141592653589793 * dVar12 * dVar12 * dVar12) /
                 (local_90 * local_90 * local_90 * local_90)) * dVar9 * dVar9 * dVar10 * dVar10 *
                 dVar11 * dVar14;
            auVar18 = vfmadd213sd_fma(auVar41,auVar95,auVar151);
            local_180 = auVar18._0_8_;
            local_170 = local_190;
          }
          else if (in_ESI == 2) {
            dVar8 = cos(((dVar15 * 3.141592653589793) / 2.0) / local_80);
            dVar15 = sin(((dVar15 * 3.141592653589793) / 2.0) / local_80);
            auVar96._8_8_ = 0;
            auVar96._0_8_ = auVar42._0_8_;
            auVar42._8_8_ = 0;
            auVar152._8_8_ = 0;
            auVar152._0_8_ = dVar12 * dVar12;
            auVar18 = vfmadd213sd_fma(auVar42,auVar96,auVar152);
            dVar12 = sqrt(auVar18._0_8_);
            if ((dVar12 != 0.0) || (NAN(dVar12))) {
              local_b8 = sin((dVar12 * 3.141592653589793) / in_XMM3_Qa);
              local_b8 = local_b8 / ((dVar12 * 3.141592653589793) / in_XMM3_Qa);
            }
            else {
              local_b8 = 1.0;
            }
            dVar12 = cos(dVar5);
            dVar9 = sin(dVar5);
            auVar97._8_8_ = 0;
            auVar97._0_8_ = dVar8;
            auVar153._8_8_ = 0;
            auVar153._0_8_ = dVar12 * dVar8;
            auVar183._8_8_ = 0;
            auVar183._0_8_ = -((3.141592653589793 / local_80) * dVar9 * dVar8 * dVar15);
            auVar18 = vfmadd213sd_fma(auVar97,auVar153,auVar183);
            local_190 = in_XMM0_Qa * local_b8 * auVar18._0_8_;
            dVar12 = sin(dVar5);
            dVar5 = cos(dVar5);
            auVar98._8_8_ = 0;
            auVar98._0_8_ = dVar8;
            auVar154._8_8_ = 0;
            auVar154._0_8_ = dVar12 * dVar8;
            auVar184._8_8_ = 0;
            auVar184._0_8_ = (3.141592653589793 / local_80) * dVar5 * dVar8 * dVar15;
            auVar18 = vfmadd213sd_fma(auVar98,auVar154,auVar184);
            local_178 = in_XMM1_Qa * local_b8 * auVar18._0_8_;
            local_188 = -local_178;
            local_168 = 0;
            local_180 = 0;
            local_170 = local_190;
          }
          else if (in_ESI == 3) {
            dVar8 = cos(((dVar15 * 3.141592653589793) / 2.0) / local_80);
            dVar15 = sin(((dVar15 * 3.141592653589793) / 2.0) / local_80);
            auVar99._8_8_ = 0;
            auVar99._0_8_ = auVar42._0_8_;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = auVar42._0_8_;
            auVar155._8_8_ = 0;
            auVar155._0_8_ = dVar12 * dVar12;
            auVar18 = vfmadd213sd_fma(auVar43,auVar99,auVar155);
            dVar12 = sqrt(auVar18._0_8_);
            if (local_88 < dVar12) {
              local_a0 = 0.0;
            }
            else {
              local_a0 = cos(((dVar12 * 3.141592653589793 * dVar12 * dVar12 * dVar12) / 2.0) /
                             (local_88 * local_88 * local_88 * local_88));
            }
            dVar12 = cos(dVar5);
            dVar9 = sin(dVar5);
            auVar100._8_8_ = 0;
            auVar100._0_8_ = dVar8;
            auVar156._8_8_ = 0;
            auVar156._0_8_ = dVar12 * dVar8;
            auVar185._8_8_ = 0;
            auVar185._0_8_ = -((3.141592653589793 / local_80) * dVar9 * dVar8 * dVar15);
            auVar18 = vfmadd213sd_fma(auVar100,auVar156,auVar185);
            local_190 = in_XMM0_Qa * local_a0 * local_a0 * auVar18._0_8_;
            dVar12 = sin(dVar5);
            dVar5 = cos(dVar5);
            auVar101._8_8_ = 0;
            auVar101._0_8_ = dVar8;
            auVar157._8_8_ = 0;
            auVar157._0_8_ = dVar12 * dVar8;
            auVar186._8_8_ = 0;
            auVar186._0_8_ = (3.141592653589793 / local_80) * dVar5 * dVar8 * dVar15;
            auVar18 = vfmadd213sd_fma(auVar101,auVar157,auVar186);
            local_178 = in_XMM1_Qa * local_a0 * local_a0 * auVar18._0_8_;
            local_188 = -local_178;
            local_168 = 0;
            local_180 = 0;
            local_170 = local_190;
          }
          if ((in_DL & 1) == 0) {
            local_180 = local_180 ^ 0x8000000000000000;
            local_188 = -local_188;
            local_190 = -local_190;
          }
          if ((in_CL & 1) == 0) {
            auVar44._8_8_ = 0;
            auVar44._0_8_ = local_168;
            auVar158._8_8_ = 0;
            auVar158._0_8_ = auVar20._0_8_;
            auVar102._8_8_ = 0;
            auVar102._0_8_ = local_170 * local_f8;
            auVar18 = vfmadd213sd_fma(auVar158,auVar44,auVar102);
            auVar103._8_8_ = 0;
            auVar103._0_8_ = local_178;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = local_110;
            auVar18 = vfmadd213sd_fma(auVar45,auVar103,auVar18);
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffc40,
                                  in_stack_fffffffffffffc3c);
            (*pppcVar2)[local_198][local_19c].ex = auVar18._0_8_;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = local_168;
            auVar159._8_8_ = 0;
            auVar159._0_8_ = dVar6;
            auVar104._8_8_ = 0;
            auVar104._0_8_ = local_170 * local_100;
            auVar18 = vfmadd213sd_fma(auVar159,auVar46,auVar104);
            auVar105._8_8_ = 0;
            auVar105._0_8_ = local_178;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = local_118;
            auVar18 = vfmadd213sd_fma(auVar47,auVar105,auVar18);
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffc40,
                                  in_stack_fffffffffffffc3c);
            (*pppcVar2)[local_198][local_19c].ey = auVar18._0_8_;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = local_168;
            auVar160._8_8_ = 0;
            auVar160._0_8_ = dVar7;
            auVar106._8_8_ = 0;
            auVar106._0_8_ = local_170 * local_108;
            auVar18 = vfmadd213sd_fma(auVar160,auVar48,auVar106);
            auVar107._8_8_ = 0;
            auVar107._0_8_ = local_178;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = local_120;
            auVar18 = vfmadd213sd_fma(auVar49,auVar107,auVar18);
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffc40,
                                  in_stack_fffffffffffffc3c);
            (*pppcVar2)[local_198][local_19c].ez = auVar18._0_8_;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = local_180;
            auVar161._8_8_ = 0;
            auVar161._0_8_ = auVar20._0_8_;
            auVar108._8_8_ = 0;
            auVar108._0_8_ = local_188 * local_f8;
            auVar18 = vfmadd213sd_fma(auVar161,auVar50,auVar108);
            auVar109._8_8_ = 0;
            auVar109._0_8_ = local_190;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = local_110;
            auVar18 = vfmadd213sd_fma(auVar51,auVar109,auVar18);
            pppcVar3 = field3d<cellb>::operator[]
                                 (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
            (*pppcVar3)[local_198][local_19c].bx = auVar18._0_8_;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = local_180;
            auVar162._8_8_ = 0;
            auVar162._0_8_ = dVar6;
            auVar110._8_8_ = 0;
            auVar110._0_8_ = local_188 * local_100;
            auVar18 = vfmadd213sd_fma(auVar162,auVar52,auVar110);
            auVar111._8_8_ = 0;
            auVar111._0_8_ = local_190;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = local_118;
            auVar18 = vfmadd213sd_fma(auVar53,auVar111,auVar18);
            pppcVar3 = field3d<cellb>::operator[]
                                 (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
            (*pppcVar3)[local_198][local_19c].by = auVar18._0_8_;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = local_180;
            auVar163._8_8_ = 0;
            auVar163._0_8_ = dVar7;
            auVar112._8_8_ = 0;
            auVar112._0_8_ = local_188 * local_108;
            auVar18 = vfmadd213sd_fma(auVar163,auVar54,auVar112);
            auVar113._8_8_ = 0;
            auVar113._0_8_ = local_190;
            auVar126 = ZEXT1664(auVar113);
            auVar55._8_8_ = 0;
            auVar55._0_8_ = local_120;
            auVar18 = vfmadd213sd_fma(auVar55,auVar113,auVar18);
            pppcVar3 = field3d<cellb>::operator[]
                                 (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
            (*pppcVar3)[local_198][local_19c].bz = auVar18._0_8_;
          }
          else {
            auVar56._8_8_ = 0;
            auVar56._0_8_ = local_168;
            auVar164._8_8_ = 0;
            auVar164._0_8_ = auVar20._0_8_;
            auVar114._8_8_ = 0;
            auVar114._0_8_ = local_170 * local_f8;
            auVar18 = vfmadd213sd_fma(auVar164,auVar56,auVar114);
            auVar115._8_8_ = 0;
            auVar115._0_8_ = local_178;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = local_110;
            auVar18 = vfmadd213sd_fma(auVar57,auVar115,auVar18);
            in_stack_fffffffffffffc40 = auVar18._0_8_;
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffc40,
                                  in_stack_fffffffffffffc3c);
            (*pppcVar2)[local_198][local_19c].ex =
                 (double)in_stack_fffffffffffffc40 + (*pppcVar2)[local_198][local_19c].ex;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = local_168;
            auVar165._8_8_ = 0;
            auVar165._0_8_ = dVar6;
            auVar116._8_8_ = 0;
            auVar116._0_8_ = local_170 * local_100;
            auVar18 = vfmadd213sd_fma(auVar165,auVar58,auVar116);
            auVar117._8_8_ = 0;
            auVar117._0_8_ = local_178;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = local_118;
            auVar18 = vfmadd213sd_fma(auVar59,auVar117,auVar18);
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffc40,
                                  in_stack_fffffffffffffc3c);
            (*pppcVar2)[local_198][local_19c].ey =
                 auVar18._0_8_ + (*pppcVar2)[local_198][local_19c].ey;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = local_168;
            auVar166._8_8_ = 0;
            auVar166._0_8_ = dVar7;
            auVar118._8_8_ = 0;
            auVar118._0_8_ = local_170 * local_108;
            auVar18 = vfmadd213sd_fma(auVar166,auVar60,auVar118);
            auVar119._8_8_ = 0;
            auVar119._0_8_ = local_178;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = local_120;
            auVar18 = vfmadd213sd_fma(auVar61,auVar119,auVar18);
            pppcVar2 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffffc40,
                                  in_stack_fffffffffffffc3c);
            (*pppcVar2)[local_198][local_19c].ez =
                 auVar18._0_8_ + (*pppcVar2)[local_198][local_19c].ez;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = local_180;
            auVar167._8_8_ = 0;
            auVar167._0_8_ = auVar20._0_8_;
            auVar120._8_8_ = 0;
            auVar120._0_8_ = local_188 * local_f8;
            auVar18 = vfmadd213sd_fma(auVar167,auVar62,auVar120);
            auVar121._8_8_ = 0;
            auVar121._0_8_ = local_190;
            auVar63._8_8_ = 0;
            auVar63._0_8_ = local_110;
            auVar18 = vfmadd213sd_fma(auVar63,auVar121,auVar18);
            pppcVar3 = field3d<cellb>::operator[]
                                 (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
            (*pppcVar3)[local_198][local_19c].bx =
                 auVar18._0_8_ + (*pppcVar3)[local_198][local_19c].bx;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = local_180;
            auVar168._8_8_ = 0;
            auVar168._0_8_ = dVar6;
            auVar122._8_8_ = 0;
            auVar122._0_8_ = local_188 * local_100;
            auVar18 = vfmadd213sd_fma(auVar168,auVar64,auVar122);
            auVar123._8_8_ = 0;
            auVar123._0_8_ = local_190;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = local_118;
            auVar18 = vfmadd213sd_fma(auVar65,auVar123,auVar18);
            pppcVar3 = field3d<cellb>::operator[]
                                 (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
            (*pppcVar3)[local_198][local_19c].by =
                 auVar18._0_8_ + (*pppcVar3)[local_198][local_19c].by;
            auVar66._8_8_ = 0;
            auVar66._0_8_ = local_180;
            auVar169._8_8_ = 0;
            auVar169._0_8_ = dVar7;
            auVar124._8_8_ = 0;
            auVar124._0_8_ = local_188 * local_108;
            auVar18 = vfmadd213sd_fma(auVar169,auVar66,auVar124);
            auVar125._8_8_ = 0;
            auVar125._0_8_ = local_190;
            auVar126 = ZEXT1664(auVar125);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = local_120;
            auVar18 = vfmadd213sd_fma(auVar67,auVar125,auVar18);
            pppcVar3 = field3d<cellb>::operator[]
                                 (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
            (*pppcVar3)[local_198][local_19c].bz =
                 auVar18._0_8_ + (*pppcVar3)[local_198][local_19c].bz;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spatial_region::f_init_cos(double a0y, double a0z, double xsigma, double ysigma, double zsigma, double x0, int sscos, bool b_sign, double x1, double phase, double y0, double z0, bool append, double phi, double xtarget, double ytarget, double ztarget)
{
    /* Для f_init_gauss xsigma, ysigma и zsigma имели смысл
     * половины масштабов лазерного импульса на уровне 1/e^2 (по
     * интенсивности) */
    /* x0 - расстояние от левой границы области (spatial_region'а) до
     * центра лазерного импульса, x1 - координата по x центра импульса
     * относительно центра всей области моделирования («суммы»
     * spatial_region'ов) */
    /* Интеграл от квадратов полей не вычисляется аналитически в
     * простой форме, поэтому используется \int a^2 dV. Поля задаются
     * таким образом, чтобы \int a^2 dV имел то же значение, что и для
     * f_init_gauss, поэтому вместо xsigma, ysigma и zsigma для
     * описания огибающей используются половины полных размеров
     * импульса xs, ys и zs */
    /* Если sscos==1, то огибающая задаётся в форме "супер-супер
     * косинуса"; для того, чтобы вычисление a_0 по энергии импульса
     * (при задании в конфиг-файле W) было верным, ширина импульса
     * вычисляется так, чтобы интеграл от квадрата его огибающей
     * совпадал с соответствующим интегралом от гауссова импульса */
    /* Если sscos == 2 (pearl), то поперечная огибающая для поля имеет вид (sin
     * r / r)^2, продольная - как для cos. zsigma не используется, ysigma -
     * расстояние от оси до первого нуля интенсивности в поперечном
     * распределении, xsigma - половина размера лазерного импульса на уровне
     * 1/e^2 (по интенсивности). E_x не вычисляется, а полагается равным нулю. */
    // sscos = 3 - sscos transverse, cos longutudinal
    double x,y,z,xi;
    double xs{0}, ys{0}, zs{0};
    if (sscos==0) {
        xs = xsigma*2*sqrt(2*PI)/3;
        ys = ysigma*2*sqrt(2*PI)/3;
        zs = zsigma*2*sqrt(2*PI)/3;
    } else if (sscos == 1) {
        xs = 0.822*xsigma;
        ys = 0.822*ysigma;
        zs = 0.822*zsigma;
    } else if (sscos == 2) {
        xs = xsigma * 2 * sqrt(2 * PI) / 3;
        ys = 1e2 * ysigma; // just >> ysigma
        zs = 1e2 * ysigma; // just >> ysigma
    } else if (sscos == 3) {
        xs = xsigma * 2 * sqrt(2 * PI) / 3;
        ys = 0.822 * ysigma;
        zs = 0.822 * zsigma;
    }
    double cosx,cosy,cosz,sinx,siny,sinz,tr_envelope;
    double y12,z12;
    y12 = 0.5*ny*dy;
    z12 = 0.5*nz*dz;
    double r0x,r0y,r0z;
    r0x = sqrt(x1*x1+y0*y0+z0*z0);
    r0y = -y0/r0x;
    r0z = -z0/r0x;
    r0x = -x1/r0x;
    double y0x,y0y,y0z,z0x,z0y,z0z;
    y0z = sqrt( r0x*r0x + r0y*r0y );
    if (y0z!=0)
    {
        y0x = -r0y/y0z;
        y0y = r0x/y0z;
        y0z = 0;
    }
    else
    {
        y0x = 0;
        y0y = 1;
        y0z = 0;
    }
    z0x = r0y*y0z - r0z*y0y;
    z0y = r0z*y0x - r0x*y0z;
    z0z = r0x*y0y - r0y*y0x;
    if (phi!=0) {
        double c,s,yx,yy,yz,zx,zy,zz;
        c = cos(phi);
        s = sin(phi);
        yx = y0x;
        yy = y0y;
        yz = y0z;
        zx = z0x;
        zy = z0y;
        zz = z0z;
        y0x = yx*c + zx*s;
        y0y = yy*c + zy*s;
        y0z = yz*c + zz*s;
        z0x = zx*c - yx*s;
        z0y = zy*c - yy*s;
        z0z = zz*c - yz*s;
    }
    double ex{0}, ey{0}, ez{0}, bx{0}, by{0}, bz{0};
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                x = r0x*(i*dx-x0-xtarget) + r0y*(j*dy-y12-y0-ytarget) + r0z*(k*dz-z12-z0-ztarget);
                xi = x + phase;
                y = y0x*(i*dx-x0-xtarget) + y0y*(j*dy-y12-y0-ytarget) + y0z*(k*dz-z12-z0-ztarget);
                z = z0x*(i*dx-x0-xtarget) + z0y*(j*dy-y12-y0-ytarget) + z0z*(k*dz-z12-z0-ztarget);
                // vector potential envelope = (cosx*cosy*cosz)^2;
                if (x<xs&&x>-xs&&y<ys&&y>-ys&&z<zs&&z>-zs)
                {
                    if (sscos==0) {
                        cosx = cos(PI*x/2/xs);
                        cosy = cos(PI*y/2/ys);
                        cosz = cos(PI*z/2/zs);
                        sinx = sin(PI*x/2/xs);
                        siny = sin(PI*y/2/ys);
                        sinz = sin(PI*z/2/zs);
                        tr_envelope = cosy*cosy*cosz*cosz;
                        ey = a0y*tr_envelope*(cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z*tr_envelope*(sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = a0y*sin(xi)*cosx*cosx*cosz*cosz*PI/ys*cosy*siny - a0z*cos(xi)*cosx*cosx*cosy*cosy*PI/zs*cosz*sinz;
                        bx = a0z*cos(xi)*cosx*cosx*PI/ys*cosz*cosz*cosy*siny + a0y*sin(xi)*cosx*cosx*cosy*cosy*PI/zs*cosz*sinz;
                    } else if (sscos == 1) {
                        cosx = cos(PI*x*x*x*x/2/(xs*xs*xs*xs));
                        cosy = cos(PI*y*y*y*y/2/(ys*ys*ys*ys));
                        cosz = cos(PI*z*z*z*z/2/(zs*zs*zs*zs));
                        sinx = sin(PI*x*x*x*x/2/(xs*xs*xs*xs));
                        siny = sin(PI*y*y*y*y/2/(ys*ys*ys*ys));
                        sinz = sin(PI*z*z*z*z/2/(zs*zs*zs*zs));
                        tr_envelope = cosy*cosy*cosz*cosz;
                        ey = a0y*tr_envelope*(cos(xi)*cosx*cosx - 4*PI*x*x*x/(xs*xs*xs*xs)*sin(xi)*cosx*sinx);
                        ez = a0z*tr_envelope*(sin(xi)*cosx*cosx + 4*PI*x*x*x/(xs*xs*xs*xs)*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = a0y*sin(xi)*4*PI*y*y*y/(ys*ys*ys*ys)*cosx*cosx*cosz*cosz*cosy*siny - a0z*cos(xi)*4*PI*z*z*z/(zs*zs*zs*zs)*cosx*cosx*cosy*cosy*cosz*sinz;
                        bx = a0z*cos(xi)*4*PI*y*y*y/(ys*ys*ys*ys)*cosx*cosx*cosz*cosz*cosy*siny + a0y*sin(xi)*4*PI*z*z*z/(zs*zs*zs*zs)*cosx*cosx*cosy*cosy*cosz*sinz;
                    } else if (sscos == 2) {
                        cosx = cos(PI*x/2/xs);
                        sinx = sin(PI*x/2/xs);
                        double r = sqrt(y * y + z * z);
                        if (r != 0) {
                            siny = sin(PI * r / ysigma) / (PI * r / ysigma);
                        } else {
                            siny = 1;
                        }
                        ey = a0y * siny * (cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z * siny * (sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = 0;
                        bx = 0;
                    }
                    else if (sscos == 3) {
                        cosx = cos(PI*x/2/xs);
                        sinx = sin(PI*x/2/xs);
                        double r = sqrt(y * y + z * z);
                        if (r <= ys)
                        {
                            cosy = cos(PI*r*r*r*r/2/(ys*ys*ys*ys));
                        }
                        else
                        {
                            cosy = 0.0;
                        }
                        ey = a0y * cosy * cosy * (cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z * cosy * cosy * (sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = 0;
                        bx = 0;
                    }
                    if (b_sign==0)
                    {
                        bx = -bx;
                        by = -by;
                        bz = -bz;
                    }
                    if (append==0)
                    {
                        // прежние значения перезаписываются
                        ce[i][j][k].ex = ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey = ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez = ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx = bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by = bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz = bx*r0z + by*y0z + bz*z0z;
                    }
                    else
                    {
                        // импульс добавляется к имеющимся полям
                        ce[i][j][k].ex += ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey += ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez += ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx += bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by += bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz += bx*r0z + by*y0z + bz*z0z;
                    }
                }
                else if (append==0)
                {
                    ce[i][j][k].ex = 0;
                    ce[i][j][k].ey = 0;
                    ce[i][j][k].ez = 0;
                    cb[i][j][k].bx = 0;
                    cb[i][j][k].by = 0;
                    cb[i][j][k].bz = 0;
                }
            }
        }
    }
}